

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O2

void __thiscall
solitaire::SolitaireHandWithOneCardAddCardTest_addCardOnFoundationPileWithHistoryRecord_Test::
~SolitaireHandWithOneCardAddCardTest_addCardOnFoundationPileWithHistoryRecord_Test
          (SolitaireHandWithOneCardAddCardTest_addCardOnFoundationPileWithHistoryRecord_Test *this)

{
  SolitaireHandWithOneCardAddCardTest::~SolitaireHandWithOneCardAddCardTest
            (&this->super_SolitaireHandWithOneCardAddCardTest);
  operator_delete(this,0x238);
  return;
}

Assistant:

TEST_F(SolitaireHandWithOneCardAddCardTest, addCardOnFoundationPileWithHistoryRecord) {
    std::optional<Card> cardToAdd {oneCard.back()};

    InSequence seq;
    expectSnapshotCreation(lastFoundationPileMock, snapshotMock2);
    expectTryingAddCardAndClearIt(lastFoundationPileMock, cardToAdd);
    expectMoveOperationSnapshotCreation(snapshotMock2)
        .WillOnce(Return(ByMove(moveOperationSnapshot.make_unique())));
    EXPECT_CALL(*historyTrackerMock, save(Pointer(moveOperationSnapshot.get())));

    solitaire.tryAddCardOnFoundationPile(lastFoundationPileId);
    EXPECT_TRUE(solitaire.getCardsInHand().empty());
}